

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

Abc_Cex_t * Gla_ManDeriveCex(Gla_Man_t *p,Vec_Int_t *vPis)

{
  int iVar1;
  Gia_Man_t *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Abc_Cex_t *pAVar6;
  Gia_Obj_t *pObj;
  
  iVar2 = p->pGia->nRegs;
  pAVar6 = Abc_CexAlloc(iVar2,p->pGia->vCis->nSize - iVar2,p->pPars->iFrame + 1);
  pAVar6->iPo = 0;
  pAVar6->iFrame = p->pPars->iFrame;
  iVar2 = 0;
  while( true ) {
    if (vPis->nSize <= iVar2) {
      return pAVar6;
    }
    p_00 = p->pGia;
    iVar3 = Vec_IntEntry(vPis,iVar2);
    pObj = Gia_ManObj(p_00,iVar3);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ObjIsPi(p->pGia,pObj);
    if (iVar3 != 0) {
      iVar3 = Gia_ObjIsPi(p->pGia,pObj);
      if (iVar3 == 0) {
        __assert_fail("Gia_ObjIsPi(p->pGia, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,200,"Abc_Cex_t *Gla_ManDeriveCex(Gla_Man_t *, Vec_Int_t *)");
      }
      for (iVar3 = 0; iVar3 <= pAVar6->iFrame; iVar3 = iVar3 + 1) {
        iVar4 = Gia_ObjId(p->pGia,pObj);
        iVar4 = Gla_ObjSatValue(p,iVar4,iVar3);
        if (iVar4 != 0) {
          iVar4 = pAVar6->nPis;
          iVar1 = pAVar6->nRegs;
          iVar5 = Gia_ObjCioId(pObj);
          iVar5 = iVar5 + iVar4 * iVar3 + iVar1;
          (&pAVar6[1].iPo)[iVar5 >> 5] = (&pAVar6[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
        }
      }
    }
    iVar2 = iVar2 + 1;
  }
  return pAVar6;
}

Assistant:

Abc_Cex_t * Gla_ManDeriveCex( Gla_Man_t * p, Vec_Int_t * vPis )
{
    Abc_Cex_t * pCex;
    Gia_Obj_t * pObj;
    int i, f;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), p->pPars->iFrame+1 );
    pCex->iPo = 0;
    pCex->iFrame = p->pPars->iFrame;
    Gia_ManForEachObjVec( vPis, p->pGia, pObj, i )
    {
        if ( !Gia_ObjIsPi(p->pGia, pObj) )
            continue;
        assert( Gia_ObjIsPi(p->pGia, pObj) );
        for ( f = 0; f <= pCex->iFrame; f++ )
            if ( Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pObj), f ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + Gia_ObjCioId(pObj) );
    }
    return pCex;
}